

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::FreeBuffer(CopyingInputStreamAdaptor *this)

{
  Nullable<const_char_*> failure_msg;
  LogMessageFatal LStack_18;
  
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                          (this->backup_bytes_,0,"backup_bytes_ == 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    this->buffer_used_ = 0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
               &this->buffer_,(pointer)0x0);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0x11a,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

void CopyingInputStreamAdaptor::FreeBuffer() {
  ABSL_CHECK_EQ(backup_bytes_, 0);
  buffer_used_ = 0;
  buffer_.reset();
}